

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmMakefile *pcVar1;
  char *__s;
  cmTarget *this;
  undefined1 local_180 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_148;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  cmTarget *local_30;
  cmTarget *t;
  cmMakefile *mf;
  char *d_local;
  char *tgt_local;
  void *arg_local;
  
  t = (cmTarget *)arg;
  mf = (cmMakefile *)d;
  d_local = tgt;
  tgt_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,tgt,&local_51);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  __s = d_local;
  pcVar1 = mf;
  local_30 = this;
  if (this == (cmTarget *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,__s,&local_e9);
    std::operator+(&local_c8,"Attempt to add link directories to non-existent target: ",&local_e8);
    std::operator+(&local_a8,&local_c8," for directory ");
    pcVar1 = mf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,(char *)pcVar1,&local_111);
    std::operator+(&local_88,&local_a8,&local_110);
    cmSystemTools::Error(&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,(char *)pcVar1,(allocator<char> *)(local_180 + 0x17));
    cmMakefile::GetBacktrace((cmMakefile *)local_180);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_148,&local_168,(cmListFileBacktrace *)local_180);
    cmTarget::InsertLinkDirectory(this,&local_148,false);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_148);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_180);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)(local_180 + 0x17));
  }
  return;
}

Assistant:

static void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                              const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: " +
      std::string(tgt) + " for directory " + std::string(d));
    return;
  }
  t->InsertLinkDirectory(BT<std::string>(d, mf->GetBacktrace()));
}